

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCommandCommand.cxx
# Opt level: O0

cmCommand * __thiscall cmLoadedCommand::Clone(cmLoadedCommand *this)

{
  cmLoadedCommand *this_00;
  cmLoadedCommand *newC;
  cmLoadedCommand *this_local;
  
  this_00 = (cmLoadedCommand *)operator_new(0xb0);
  cmLoadedCommand(this_00);
  memcpy(&this_00->info,&this->info,0x60);
  return &this_00->super_cmCommand;
}

Assistant:

virtual cmCommand* Clone()
    {
      cmLoadedCommand *newC = new cmLoadedCommand;
      // we must copy when we clone
      memcpy(&newC->info,&this->info,sizeof(info));
      return newC;
    }